

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_b57f11::RunCommand
               (string *command,string *output,int *retVal,char *dir,bool verbose,Encoding encoding)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  string local_1c0 [8];
  string msg;
  string local_180;
  undefined1 local_160 [8];
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_138;
  int p;
  char *data;
  char *pcStack_128;
  int length;
  char *cmd [4];
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_98 [8];
  string commandInDir;
  allocator<char> local_61;
  string local_60;
  cmsysProcess *local_40;
  cmsysProcess *cp;
  Encoding encoding_local;
  bool verbose_local;
  char *dir_local;
  int *retVal_local;
  string *output_local;
  string *command_local;
  
  cp._0_4_ = encoding;
  cp._7_1_ = verbose;
  _encoding_local = dir;
  dir_local = (char *)retVal;
  retVal_local = (int *)output;
  output_local = command;
  bVar1 = cmSystemTools::GetRunCommandOutput();
  if (bVar1) {
    cp._7_1_ = 0;
  }
  local_40 = cmsysProcess_New();
  if (local_40 == (cmsysProcess *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Error allocating process instance.",&local_61);
    cmSystemTools::Error(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    command_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string(local_98);
    if (_encoding_local == (char *)0x0) {
      std::__cxx11::string::operator=(local_98,(string *)command);
    }
    else {
      cmStrCat<char_const(&)[5],char_const*&,char_const(&)[6],std::__cxx11::string&>
                (&local_b8,(char (*) [5])"cd \"",(char **)&encoding_local,(char (*) [6])"\" && ",
                 command);
      std::__cxx11::string::operator=(local_98,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::__cxx11::string::operator+=(local_98," 2>&1");
    std::__cxx11::string::operator=((string *)command,local_98);
    if ((cp._7_1_ & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"running ",&local_d9);
      cmSystemTools::Stdout(&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      cmSystemTools::Stdout(command);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"\n",(allocator<char> *)((long)cmd + 0x1f));
      cmSystemTools::Stdout(&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)((long)cmd + 0x1f));
    }
    fflush(_stdout);
    fflush(_stderr);
    pcStack_128 = "/bin/sh";
    cmd[0] = "-c";
    cmd[1] = (char *)std::__cxx11::string::c_str();
    cmd[2] = (char *)0x0;
    cmsysProcess_SetCommand(local_40,&stack0xfffffffffffffed8);
    cmsysProcess_Execute(local_40);
    cmProcessOutput::cmProcessOutput
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),(Encoding)cp,0x400);
    std::__cxx11::string::string((string *)local_160);
    while (strdata.field_2._12_4_ =
                cmsysProcess_WaitForData
                          (local_40,&stack0xfffffffffffffec8,(int *)((long)&data + 4),(double *)0x0)
          , strdata.field_2._12_4_ != 0) {
      if ((strdata.field_2._12_4_ == 2) || (strdata.field_2._12_4_ == 3)) {
        if ((cp._7_1_ & 1) != 0) {
          cmProcessOutput::DecodeText
                    ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_138,
                     (long)data._4_4_,(string *)local_160,0);
          cmSystemTools::Stdout((string *)local_160);
        }
        std::__cxx11::string::append((char *)retVal_local,(ulong)pcStack_138);
      }
    }
    if ((cp._7_1_ & 1) != 0) {
      std::__cxx11::string::string((string *)&local_180);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_180,
                 (string *)local_160,0);
      std::__cxx11::string::~string((string *)&local_180);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        cmSystemTools::Stdout((string *)local_160);
      }
    }
    cmsysProcess_WaitForExit(local_40,(double *)0x0);
    std::__cxx11::string::string((string *)(msg.field_2._M_local_buf + 8),(string *)retVal_local);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),
               (string *)((long)&msg.field_2 + 8),(string *)retVal_local,0);
    std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_1c0);
    iVar2 = cmsysProcess_GetState(local_40);
    switch(iVar2) {
    case 1:
      dir_local[0] = -1;
      dir_local[1] = -1;
      dir_local[2] = -1;
      dir_local[3] = -1;
      std::__cxx11::string::operator+=(local_1c0,"\nProcess failed because: ");
      pcVar4 = cmsysProcess_GetErrorString(local_40);
      std::__cxx11::string::operator+=(local_1c0,pcVar4);
      break;
    case 2:
      dir_local[0] = -1;
      dir_local[1] = -1;
      dir_local[2] = -1;
      dir_local[3] = -1;
      std::__cxx11::string::operator+=(local_1c0,"\nProcess terminated due to: ");
      pcVar4 = cmsysProcess_GetExceptionString(local_40);
      std::__cxx11::string::operator+=(local_1c0,pcVar4);
      break;
    case 4:
      iVar2 = cmsysProcess_GetExitValue(local_40);
      *(int *)dir_local = iVar2;
      break;
    case 5:
      dir_local[0] = -1;
      dir_local[1] = -1;
      dir_local[2] = -1;
      dir_local[3] = -1;
      std::__cxx11::string::operator+=(local_1c0,"\nProcess terminated due to timeout.");
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)retVal_local,local_1c0);
    }
    cmsysProcess_Delete(local_40);
    command_local._7_1_ = 1;
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string(local_98);
  }
  return (bool)(command_local._7_1_ & 1);
}

Assistant:

bool RunCommand(std::string command, std::string& output, int& retVal,
                const char* dir, bool verbose, Encoding encoding)
{
  if (cmSystemTools::GetRunCommandOutput()) {
    verbose = false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  // if the command does not start with a quote, then
  // try to find the program, and if the program can not be
  // found use system to run the command as it must be a built in
  // shell command like echo or dir
  if (!command.empty() && command[0] == '\"') {
    // count the number of quotes
    int count = 0;
    for (char c : command) {
      if (c == '\"') {
        count++;
        if (count > 2) {
          break;
        }
      }
    }
    // if there are more than two double quotes use
    // GetShortPathName, the cmd.exe program in windows which
    // is used by system fails to execute if there are more than
    // one set of quotes in the arguments
    if (count > 2) {
      cmsys::RegularExpression quoted("^\"([^\"]*)\"[ \t](.*)");
      if (quoted.find(command)) {
        std::string shortCmd;
        std::string cmd = quoted.match(1);
        std::string args = quoted.match(2);
        if (!cmSystemTools::FileExists(cmd)) {
          shortCmd = cmd;
        } else if (!cmSystemTools::GetShortPath(cmd, shortCmd)) {
          cmSystemTools::Error("GetShortPath failed for " + cmd);
          return false;
        }
        shortCmd += " ";
        shortCmd += args;

        command = shortCmd;
      } else {
        cmSystemTools::Error("Could not parse command line with quotes " +
                             command);
      }
    }
  }
#endif

  // Allocate a process instance.
  cmsysProcess* cp = cmsysProcess_New();
  if (!cp) {
    cmSystemTools::Error("Error allocating process instance.");
    return false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if (dir) {
    cmsysProcess_SetWorkingDirectory(cp, dir);
  }
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }
  cmsysProcess_SetOption(cp, cmsysProcess_Option_Verbatim, 1);
  const char* cmd[] = { command.c_str(), nullptr };
  cmsysProcess_SetCommand(cp, cmd);
#else
  std::string commandInDir;
  if (dir) {
    commandInDir = cmStrCat("cd \"", dir, "\" && ", command);
  } else {
    commandInDir = command;
  }
#  ifndef __VMS
  commandInDir += " 2>&1";
#  endif
  command = commandInDir;
  if (verbose) {
    cmSystemTools::Stdout("running ");
    cmSystemTools::Stdout(command);
    cmSystemTools::Stdout("\n");
  }
  fflush(stdout);
  fflush(stderr);
  const char* cmd[] = { "/bin/sh", "-c", command.c_str(), nullptr };
  cmsysProcess_SetCommand(cp, cmd);
#endif

  cmsysProcess_Execute(cp);

  // Read the process output.
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    if (p == cmsysProcess_Pipe_STDOUT || p == cmsysProcess_Pipe_STDERR) {
      if (verbose) {
        processOutput.DecodeText(data, length, strdata);
        cmSystemTools::Stdout(strdata);
      }
      output.append(data, length);
    }
  }

  if (verbose) {
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(output, output);

  // Check the result of running the process.
  std::string msg;
  switch (cmsysProcess_GetState(cp)) {
    case cmsysProcess_State_Exited:
      retVal = cmsysProcess_GetExitValue(cp);
      break;
    case cmsysProcess_State_Exception:
      retVal = -1;
      msg += "\nProcess terminated due to: ";
      msg += cmsysProcess_GetExceptionString(cp);
      break;
    case cmsysProcess_State_Error:
      retVal = -1;
      msg += "\nProcess failed because: ";
      msg += cmsysProcess_GetErrorString(cp);
      break;
    case cmsysProcess_State_Expired:
      retVal = -1;
      msg += "\nProcess terminated due to timeout.";
      break;
  }
  if (!msg.empty()) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    // Old Windows process execution printed this info.
    msg += "\n\nfor command: ";
    msg += command;
    if (dir) {
      msg += "\nin dir: ";
      msg += dir;
    }
    msg += "\n";
    if (verbose) {
      cmSystemTools::Stdout(msg);
    }
    output += msg;
#else
    // Old UNIX process execution only put message in output.
    output += msg;
#endif
  }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}